

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder.hpp
# Opt level: O1

int __thiscall
zmq::decoder_base_t<zmq::v2_decoder_t,_zmq::shared_message_memory_allocator>::decode
          (decoder_base_t<zmq::v2_decoder_t,_zmq::shared_message_memory_allocator> *this,
          uchar *data_,size_t size_,size_t *bytes_used_)

{
  ulong uVar1;
  size_t sVar2;
  int iVar3;
  ulong uVar4;
  code *pcVar5;
  int unaff_EBP;
  long *plVar6;
  ulong __n;
  
  *bytes_used_ = 0;
  if (this->_read_pos == data_) {
    if (this->_to_read < size_) {
      decoder_base_t<zmq::v2_decoder_t,zmq::shared_message_memory_allocator>::decode();
    }
    this->_read_pos = this->_read_pos + size_;
    this->_to_read = this->_to_read - size_;
    *bytes_used_ = size_;
    do {
      if (this->_to_read != 0) {
        return 0;
      }
      pcVar5 = (code *)this->_next;
      plVar6 = (long *)((long)&(this->super_i_decoder)._vptr_i_decoder + *(long *)&this->field_0x10)
      ;
      if (((ulong)pcVar5 & 1) != 0) {
        pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
      }
      iVar3 = (*pcVar5)(plVar6,data_ + *bytes_used_);
    } while (iVar3 == 0);
  }
  else {
    do {
      uVar1 = *bytes_used_;
      uVar4 = size_ - uVar1;
      if (size_ < uVar1 || uVar4 == 0) {
        return 0;
      }
      __n = this->_to_read;
      if (uVar4 < this->_to_read) {
        __n = uVar4;
      }
      if (this->_read_pos != data_ + uVar1) {
        memcpy(this->_read_pos,data_ + uVar1,__n);
      }
      this->_read_pos = this->_read_pos + __n;
      this->_to_read = this->_to_read - __n;
      *bytes_used_ = *bytes_used_ + __n;
      do {
        sVar2 = this->_to_read;
        iVar3 = unaff_EBP;
        if (sVar2 != 0) break;
        pcVar5 = (code *)this->_next;
        plVar6 = (long *)((long)&(this->super_i_decoder)._vptr_i_decoder +
                         *(long *)&this->field_0x10);
        if (((ulong)pcVar5 & 1) != 0) {
          pcVar5 = *(code **)(pcVar5 + *plVar6 + -1);
        }
        iVar3 = (*pcVar5)(plVar6,data_ + *bytes_used_);
      } while (iVar3 == 0);
      unaff_EBP = iVar3;
    } while (sVar2 != 0);
  }
  return iVar3;
}

Assistant:

int decode (const unsigned char *data_,
                std::size_t size_,
                std::size_t &bytes_used_) ZMQ_FINAL
    {
        bytes_used_ = 0;

        //  In case of zero-copy simply adjust the pointers, no copying
        //  is required. Also, run the state machine in case all the data
        //  were processed.
        if (data_ == _read_pos) {
            zmq_assert (size_ <= _to_read);
            _read_pos += size_;
            _to_read -= size_;
            bytes_used_ = size_;

            while (!_to_read) {
                const int rc =
                  (static_cast<T *> (this)->*_next) (data_ + bytes_used_);
                if (rc != 0)
                    return rc;
            }
            return 0;
        }

        while (bytes_used_ < size_) {
            //  Copy the data from buffer to the message.
            const size_t to_copy = std::min (_to_read, size_ - bytes_used_);
            // Only copy when destination address is different from the
            // current address in the buffer.
            if (_read_pos != data_ + bytes_used_) {
                memcpy (_read_pos, data_ + bytes_used_, to_copy);
            }

            _read_pos += to_copy;
            _to_read -= to_copy;
            bytes_used_ += to_copy;
            //  Try to get more space in the message to fill in.
            //  If none is available, return.
            while (_to_read == 0) {
                // pass current address in the buffer
                const int rc =
                  (static_cast<T *> (this)->*_next) (data_ + bytes_used_);
                if (rc != 0)
                    return rc;
            }
        }

        return 0;
    }